

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function
          (Dynamic_Object_Function *this,string *t_type_name,Proxy_Function *t_func,
          bool t_is_attribute)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_40;
  
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_40,
             &((t_func->
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->m_types);
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,&local_40,
             ((t_func->
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->m_arity);
  if (local_40.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Object_Function_0023b630;
  paVar1 = &(this->m_type_name).field_2;
  (this->m_type_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (t_type_name->_M_dataplus)._M_p;
  paVar2 = &t_type_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&t_type_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_type_name).field_2 + 8) = uVar5;
  }
  else {
    (this->m_type_name)._M_dataplus._M_p = pcVar3;
    (this->m_type_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_type_name)._M_string_length = t_type_name->_M_string_length;
  (t_type_name->_M_dataplus)._M_p = (pointer)paVar2;
  t_type_name->_M_string_length = 0;
  (t_type_name->field_2)._M_local_buf[0] = '\0';
  (this->m_func).
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t_func->
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Var4 = (t_func->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->m_func).
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (this->m_ti)._M_t.
  super___uniq_ptr_impl<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>._M_t.
  super__Tuple_impl<0UL,_chaiscript::Type_Info_*,_std::default_delete<chaiscript::Type_Info>_>.
  super__Head_base<0UL,_chaiscript::Type_Info_*,_false>._M_head_impl = (Type_Info *)0x0;
  (this->m_doti).m_type_info = (type_info *)&Dynamic_Object::typeinfo;
  (this->m_doti).m_bare_type_info = (type_info *)&Dynamic_Object::typeinfo;
  (this->m_doti).m_flags = 0;
  this->m_is_attribute = t_is_attribute;
  if (((t_func->
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->m_arity != 0) {
    return;
  }
  __assert_fail("(t_func->get_arity() > 0 || t_func->get_arity() < 0) && \"Programming error, Dynamic_Object_Function must have at least one parameter (this)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/../dispatchkit/dynamic_object_detail.hpp"
                ,0x30,
                "chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function(std::string, const Proxy_Function &, bool)"
               );
}

Assistant:

Dynamic_Object_Function(std::string t_type_name, const Proxy_Function &t_func, bool t_is_attribute = false)
            : Proxy_Function_Base(t_func->get_param_types(), t_func->get_arity())
            , m_type_name(std::move(t_type_name))
            , m_func(t_func)
            , m_doti(user_type<Dynamic_Object>())
            , m_is_attribute(t_is_attribute) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }